

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Call.hpp
# Opt level: O0

void __thiscall
Call<unsigned_long>::
Args4<const_String_&,_const_String_&,_const_String_&,_const_String_&,_String,_String,_String,_String>
::Args4(Args4<const_String_&,_const_String_&,_const_String_&,_const_String_&,_String,_String,_String,_String>
        *this,_func_unsigned_long_String_ptr_String_ptr_String_ptr_String_ptr *a,String *p,String *q
       ,String *r,String *s,void *z)

{
  String *s_local;
  String *r_local;
  String *q_local;
  String *p_local;
  _func_unsigned_long_String_ptr_String_ptr_String_ptr_String_ptr *a_local;
  Args4<const_String_&,_const_String_&,_const_String_&,_const_String_&,_String,_String,_String,_String>
  *this_local;
  
  Func4<const_String_&,_const_String_&,_const_String_&,_const_String_&>::Func4
            (&this->super_Func4<const_String_&,_const_String_&,_const_String_&,_const_String_&>,a);
  String::String(&this->p,p);
  String::String(&this->q,q);
  String::String(&this->r,r);
  String::String(&this->s,s);
  this->z = z;
  return;
}

Assistant:

Args4(A (*a)(D, E, F, G), const P& p, const Q& q, const R& r, const S& s, void* z) : Func4<D, E, F, G>(a), p(p), q(q), r(r), s(s), z(z) {}